

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O0

void stats_print_atexit(void)

{
  uint uVar1;
  long *in_FS_OFFSET;
  tcache_t *tcache;
  arena_t *arena;
  uint i;
  uint narenas;
  tsdn_t *tsdn;
  tsd_t *tsd;
  undefined8 in_stack_ffffffffffffff98;
  tsd_t *in_stack_ffffffffffffffa0;
  arena_t *in_stack_ffffffffffffffa8;
  uint uVar2;
  arena_t *tsdn_00;
  arena_t *arena_00;
  arena_t *in_stack_ffffffffffffffc8;
  arena_t *in_stack_ffffffffffffffd0;
  
  if (tsd_booted) {
    tsdn_00 = (arena_t *)*in_FS_OFFSET;
    in_stack_ffffffffffffffc8 = tsdn_00;
    in_stack_ffffffffffffffd0 = tsdn_00;
    if ((uint8_t)tsdn_00->nthreads[0].repr != '\0') {
      tsdn_00 = (arena_t *)
                tsd_fetch_slow(in_stack_ffffffffffffffa0,
                               SUB81((ulong)in_stack_ffffffffffffff98 >> 0x38,0));
      in_stack_ffffffffffffffc8 = tsdn_00;
    }
  }
  else {
    tsdn_00 = (arena_t *)0x0;
  }
  uVar2 = 0;
  arena_00 = tsdn_00;
  uVar1 = narenas_total_get();
  for (; uVar2 < uVar1; uVar2 = uVar2 + 1) {
    in_stack_ffffffffffffffa8 =
         arena_get((tsdn_t *)arena_00,(uint)((ulong)tsdn_00 >> 0x20),SUB81((ulong)tsdn_00 >> 0x18,0)
                  );
    if (in_stack_ffffffffffffffa8 != (arena_t *)0x0) {
      malloc_mutex_lock((tsdn_t *)tsdn_00,(malloc_mutex_t *)CONCAT44(uVar1,uVar2));
      in_stack_ffffffffffffffa0 = (tsd_t *)(in_stack_ffffffffffffffa8->tcache_ql).qlh_first;
      while (in_stack_ffffffffffffffa0 != (tsd_t *)0x0) {
        tcache_stats_merge((tsdn_t *)in_stack_ffffffffffffffd0,(tcache_t *)in_stack_ffffffffffffffc8
                           ,arena_00);
        if ((tcache_t *)
            (in_stack_ffffffffffffffa0->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache
            ).bins_small[0xf].tstats.nrequests == (in_stack_ffffffffffffffa8->tcache_ql).qlh_first)
        {
          in_stack_ffffffffffffffa0 = (tsd_t *)0x0;
        }
        else {
          in_stack_ffffffffffffffa0 =
               (tsd_t *)(in_stack_ffffffffffffffa0->
                        cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small
                        [0xf].tstats.nrequests;
        }
      }
      malloc_mutex_unlock((tsdn_t *)CONCAT44(uVar1,uVar2),
                          (malloc_mutex_t *)in_stack_ffffffffffffffa8);
    }
  }
  je_malloc_stats_print
            ((_func_void_void_ptr_char_ptr *)CONCAT44(uVar1,uVar2),in_stack_ffffffffffffffa8,
             (char *)in_stack_ffffffffffffffa0);
  return;
}

Assistant:

static void
stats_print_atexit(void) {
	if (config_stats) {
		tsdn_t *tsdn;
		unsigned narenas, i;

		tsdn = tsdn_fetch();

		/*
		 * Merge stats from extant threads.  This is racy, since
		 * individual threads do not lock when recording tcache stats
		 * events.  As a consequence, the final stats may be slightly
		 * out of date by the time they are reported, if other threads
		 * continue to allocate.
		 */
		for (i = 0, narenas = narenas_total_get(); i < narenas; i++) {
			arena_t *arena = arena_get(tsdn, i, false);
			if (arena != NULL) {
				tcache_t *tcache;

				malloc_mutex_lock(tsdn, &arena->tcache_ql_mtx);
				ql_foreach(tcache, &arena->tcache_ql, link) {
					tcache_stats_merge(tsdn, tcache, arena);
				}
				malloc_mutex_unlock(tsdn,
				    &arena->tcache_ql_mtx);
			}
		}
	}
	je_malloc_stats_print(NULL, NULL, opt_stats_print_opts);
}